

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86IMUL(uchar *stream,x86Reg srcdst,int num)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  int num_local;
  x86Reg srcdst_local;
  uchar *stream_local;
  
  if ((char)num == num) {
    uVar2 = encodeRex(stream,false,srcdst,rNONE,srcdst);
    puVar3 = stream + uVar2;
    *puVar3 = 'k';
    uVar1 = encodeRegister(srcdst,regCode[srcdst]);
    puVar3[1] = uVar1;
    uVar2 = encodeImmByte(puVar3 + 2,(char)num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  else {
    uVar2 = encodeRex(stream,false,srcdst,rNONE,srcdst);
    puVar3 = stream + uVar2;
    *puVar3 = 'i';
    uVar1 = encodeRegister(srcdst,regCode[srcdst]);
    puVar3[1] = uVar1;
    uVar2 = encodeImmDword(puVar3 + 2,num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg srcdst, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
		*stream++ = 0x6b;
		*stream++ = encodeRegister(srcdst, regCode[srcdst]);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
	*stream++ = 0x69;
	*stream++ = encodeRegister(srcdst, regCode[srcdst]);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}